

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  size_type *psVar1;
  pointer pcVar2;
  size_type sVar3;
  cmListFileFunction *pcVar4;
  pointer pcVar5;
  char cVar6;
  ulong uVar7;
  ostream *poVar8;
  cmListFileContext *in_RCX;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  Internals *pIVar13;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  lVar11 = fb[10].StartingContext.Line;
  if (*(long *)((long)&fb[10].StartingContext.FilePath.field_2 + 8) == lVar11) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ulong *)(lVar11 + -8);
  }
  pcVar2 = fb[10].StartingContext.FilePath._M_dataplus._M_p;
  sVar3 = fb[10].StartingContext.FilePath._M_string_length;
  uVar12 = (long)(sVar3 - (long)pcVar2) >> 3;
  pIVar13 = (Internals *)0x0;
  uVar9 = uVar12;
  lVar11 = 0;
  do {
    lVar10 = lVar11;
    if (uVar9 <= uVar7) goto LAB_00269f40;
    uVar9 = uVar9 - 1;
    pcVar4 = *(cmListFileFunction **)((sVar3 - 8) + lVar10);
    lVar11 = lVar10 + -8;
  } while (pcVar4 != lff);
  cVar6 = (**(code **)((pcVar4->super_cmListFileContext).Name._M_dataplus._M_p + 8))
                    (pcVar4,in_RCX,fb);
  if (cVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar8 = operator<<((ostream *)local_1a8,
                        (cmListFileContext *)&(lff->super_cmListFileContext).Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"closes on the line\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
    poVar8 = operator<<(poVar8,in_RCX);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"with mis-matching arguments.",0x1c);
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  pcVar2 = pcVar2 + uVar12 * 8;
  pIVar13 = *(Internals **)(pcVar2 + lVar11);
  pcVar5 = (pointer)fb[10].StartingContext.FilePath._M_string_length;
  if (pcVar2 + lVar10 != pcVar5) {
    memmove(pcVar2 + lVar11,pcVar2 + lVar10,(size_t)(pcVar5 + (-lVar11 - (long)pcVar2) + -8));
  }
  psVar1 = &fb[10].StartingContext.FilePath._M_string_length;
  *psVar1 = *psVar1 - 8;
LAB_00269f40:
  (this->Internal).x_ = pIVar13;
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

cmsys::auto_ptr<cmFunctionBlocker>
cmMakefile::RemoveFunctionBlocker(cmFunctionBlocker* fb,
                                  const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if(!this->FunctionBlockerBarriers.empty())
    {
    barrier = this->FunctionBlockerBarriers.back();
    }

  // Search for the function blocker whose scope this command ends.
  for(FunctionBlockersType::size_type
        i = this->FunctionBlockers.size(); i > barrier; --i)
    {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb)
      {
      // Warn if the arguments do not match, but always remove.
      if(!(*pos)->ShouldRemove(lff, *this))
        {
        cmListFileContext const& lfc = fb->GetStartingContext();
        std::ostringstream e;
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << lff << "\n"
          << "with mis-matching arguments.";
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return cmsys::auto_ptr<cmFunctionBlocker>(b);
      }
    }

  return cmsys::auto_ptr<cmFunctionBlocker>();
}